

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

uint lws_retry_get_delay_ms(lws_context *context,lws_retry_bo_t *retry,uint16_t *ctry,char *conceal)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uint *puVar3;
  size_t sVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t ra;
  
  if (conceal != (char *)0x0) {
    *conceal = '\0';
  }
  if (retry == (lws_retry_bo_t *)0x0) {
    uVar8 = 0x1e;
    uVar7 = 3000;
  }
  else {
    if (*ctry < retry->retry_ms_table_count) {
      puVar3 = retry->retry_ms_table + *ctry;
    }
    else {
      puVar3 = retry->retry_ms_table + ((ulong)retry->retry_ms_table_count - 1);
    }
    uVar7 = *puVar3;
    bVar2 = (byte)*(undefined4 *)&retry->jitter_percent;
    bVar5 = 0x1e;
    if (bVar2 != 0) {
      bVar5 = bVar2;
    }
    uVar8 = (ulong)bVar5;
  }
  sVar4 = lws_get_random(context,&ra,2);
  if (sVar4 == 2) {
    if (*ctry == 0xffff) {
      uVar6 = 0xffff;
    }
    else {
      uVar6 = *ctry + 1;
      *ctry = uVar6;
    }
    if (conceal != (char *)0x0 && retry != (lws_retry_bo_t *)0x0) {
      *conceal = uVar6 <= retry->conceal_count;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8 * uVar7 * (ulong)ra;
    return SUB164(auVar1 / ZEXT816(0x640000),0) + uVar7;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/network.c"
                ,0x18c,
                "unsigned int lws_retry_get_delay_ms(struct lws_context *, const lws_retry_bo_t *, uint16_t *, char *)"
               );
}

Assistant:

unsigned int
lws_retry_get_delay_ms(struct lws_context *context,
		       const lws_retry_bo_t *retry, uint16_t *ctry,
		       char *conceal)
{
	uint64_t ms = 3000, pc = 30; /* sane-ish defaults if no retry table */
	uint16_t ra;

	if (conceal)
		*conceal = 0;

	if (retry) {
		if (*ctry < retry->retry_ms_table_count)
			ms = retry->retry_ms_table[*ctry];
		else
			ms = retry->retry_ms_table[
				retry->retry_ms_table_count - 1];

		/* if no percent given, use the default 30% */
		if (retry->jitter_percent)
			pc = retry->jitter_percent;
	}

	if (lws_get_random(context, &ra, sizeof(ra)) == sizeof(ra))
		ms += ((ms * pc * ra) >> 16) / 100;
	else
		assert(0);

	if (*ctry < 0xffff)
		(*ctry)++;

	if (retry && conceal)
		*conceal = (int)*ctry <= retry->conceal_count;

	return (unsigned int)ms;
}